

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O0

Type * LLVMBC::resolve_gep_element_type(Type *type,Vector<Value_*> *args)

{
  Value *value;
  undefined8 uVar1;
  TypeID TVar2;
  uint uVar3;
  size_type sVar4;
  const_reference ppVVar5;
  Constant *this;
  LoggingCallback p_Var6;
  void *pvVar7;
  APInt *this_00;
  uint64_t uVar8;
  StructType *pSVar9;
  VectorType *this_01;
  char local_2058 [8];
  char buffer_1 [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb_1;
  char local_1048 [4];
  uint index;
  char buffer [4096];
  _func_void_void_ptr_LogLevel_char_ptr *cb;
  ConstantInt *const_int;
  Value *arg;
  uint i;
  Vector<Value_*> *args_local;
  Type *type_local;
  
  arg._4_4_ = 2;
  args_local = (Vector<Value_*> *)type;
  do {
    sVar4 = std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::size
                      (args);
    if (sVar4 <= arg._4_4_) {
      return (Type *)args_local;
    }
    ppVVar5 = std::vector<LLVMBC::Value_*,_dxil_spv::ThreadLocalAllocator<LLVMBC::Value_*>_>::
              operator[](args,(ulong)arg._4_4_);
    value = *ppVVar5;
    TVar2 = Type::getTypeID((Type *)args_local);
    if (TVar2 == StructTyID) {
      this = &dyn_cast<LLVMBC::ConstantInt>(value)->super_Constant;
      if (this == (Constant *)0x0) {
        p_Var6 = dxil_spv::get_thread_log_callback();
        if (p_Var6 == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: Indexing into a struct without a constant integer.\n");
          fflush(_stderr);
        }
        else {
          snprintf(local_1048,0x1000,"Indexing into a struct without a constant integer.\n");
          pvVar7 = dxil_spv::get_thread_log_callback_userdata();
          (*p_Var6)(pvVar7,Error,local_1048);
        }
        return (Type *)0x0;
      }
      this_00 = Constant::getUniqueInteger(this);
      uVar8 = APInt::getZExtValue(this_00);
      pSVar9 = cast<LLVMBC::StructType>((Type *)args_local);
      uVar3 = StructType::getNumElements(pSVar9);
      if (uVar3 <= (uint)uVar8) {
        buffer_1._4088_8_ = dxil_spv::get_thread_log_callback();
        if ((LoggingCallback)buffer_1._4088_8_ == (LoggingCallback)0x0) {
          fprintf(_stderr,"[ERROR]: Struct element index out of range.\n");
          fflush(_stderr);
        }
        else {
          snprintf(local_2058,0x1000,"Struct element index out of range.\n");
          uVar1 = buffer_1._4088_8_;
          pvVar7 = dxil_spv::get_thread_log_callback_userdata();
          (*(code *)uVar1)(pvVar7,2,local_2058);
        }
        return (Type *)0x0;
      }
      pSVar9 = cast<LLVMBC::StructType>((Type *)args_local);
      args_local = (Vector<Value_*> *)StructType::getElementType(pSVar9,(uint)uVar8);
    }
    else {
      TVar2 = Type::getTypeID((Type *)args_local);
      if (TVar2 == ArrayTyID) {
        args_local = (Vector<Value_*> *)Type::getArrayElementType((Type *)args_local);
      }
      else {
        TVar2 = Type::getTypeID((Type *)args_local);
        if (TVar2 != VectorTyID) {
          return (Type *)0x0;
        }
        this_01 = cast<LLVMBC::VectorType>((Type *)args_local);
        args_local = (Vector<Value_*> *)VectorType::getElementType(this_01);
      }
    }
    arg._4_4_ = arg._4_4_ + 1;
  } while( true );
}

Assistant:

static Type *resolve_gep_element_type(Type *type, const Vector<Value *> &args)
{
	for (unsigned i = 2; i < args.size(); i++)
	{
		auto *arg = args[i];
		if (type->getTypeID() == Type::TypeID::StructTyID)
		{
			auto *const_int = dyn_cast<ConstantInt>(arg);
			if (!const_int)
			{
				LOGE("Indexing into a struct without a constant integer.\n");
				return nullptr;
			}

			unsigned index = const_int->getUniqueInteger().getZExtValue();
			if (index >= cast<StructType>(type)->getNumElements())
			{
				LOGE("Struct element index out of range.\n");
				return nullptr;
			}
			type = cast<StructType>(type)->getElementType(index);
		}
		else if (type->getTypeID() == Type::TypeID::ArrayTyID)
		{
			type = type->getArrayElementType();
		}
		else if (type->getTypeID() == Type::TypeID::VectorTyID)
		{
			type = cast<VectorType>(type)->getElementType();
		}
		else
			return nullptr;
	}

	return type;
}